

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<std::array<double,3ul>,double>
               (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *src,
               vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,double eps)

{
  uint uVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  pointer paVar4;
  pointer paVar5;
  _Hash_node_base *p_Var6;
  pointer puVar7;
  mapped_type *pmVar8;
  __node_base _Var9;
  __hash_code __code;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  size_type __new_size;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<double,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>_>
  vdata;
  uint local_7c;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *local_78;
  double local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)0x0) {
    bVar11 = false;
  }
  else {
    puVar7 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (long)puVar2 - (long)puVar7 >> 2;
    bVar11 = false;
    if ((((long)(src->
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(src->
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar10 == 0
        ) && (2 < uVar10)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      if (puVar2 == puVar7) {
        __new_size = 1;
      }
      else {
        uVar10 = 0;
        uVar12 = 0;
        local_78 = dst;
        local_70 = eps;
        do {
          local_7c = puVar7[uVar10];
          if (uVar12 < local_7c) {
            uVar12 = local_7c;
          }
          if (local_68._M_buckets[(ulong)local_7c % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var3 = local_68._M_buckets[(ulong)local_7c % local_68._M_bucket_count]->_M_nxt;
            uVar1 = *(uint *)&p_Var3[1]._M_nxt;
            do {
              if (local_7c == uVar1) {
                pmVar8 = ::std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_7c);
                paVar4 = (src->
                         super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                dVar13 = ABS(pmVar8->_M_elems[0] - paVar4[uVar10]._M_elems[0]);
                if (local_70 < dVar13) {
                  dVar16 = ABS(pmVar8->_M_elems[0]);
                  dVar14 = ABS(paVar4[uVar10]._M_elems[0]);
                  dVar15 = dVar14;
                  if (dVar14 <= dVar16) {
                    dVar15 = dVar16;
                  }
                  if (dVar13 <= (double)(~-(ulong)NAN(dVar16) & (ulong)dVar15 |
                                        -(ulong)NAN(dVar16) & (ulong)dVar14) * local_70)
                  goto LAB_003793ea;
                }
                else {
LAB_003793ea:
                  dVar13 = ABS(pmVar8->_M_elems[1] - paVar4[uVar10]._M_elems[1]);
                  if (local_70 < dVar13) {
                    dVar16 = ABS(pmVar8->_M_elems[1]);
                    dVar14 = ABS(paVar4[uVar10]._M_elems[1]);
                    dVar15 = dVar14;
                    if (dVar14 <= dVar16) {
                      dVar15 = dVar16;
                    }
                    if ((double)(~-(ulong)NAN(dVar16) & (ulong)dVar15 |
                                -(ulong)NAN(dVar16) & (ulong)dVar14) * local_70 < dVar13)
                    goto LAB_0037954f;
                  }
                  dVar13 = ABS(pmVar8->_M_elems[2] - paVar4[uVar10]._M_elems[2]);
                  if (dVar13 <= local_70) goto LAB_003794d5;
                  dVar16 = ABS(pmVar8->_M_elems[2]);
                  dVar14 = ABS(paVar4[uVar10]._M_elems[2]);
                  dVar15 = dVar14;
                  if (dVar14 <= dVar16) {
                    dVar15 = dVar16;
                  }
                  if (dVar13 <= (double)(~-(ulong)NAN(dVar16) & (ulong)dVar15 |
                                        -(ulong)NAN(dVar16) & (ulong)dVar14) * local_70)
                  goto LAB_003794d5;
                }
LAB_0037954f:
                bVar11 = false;
                goto LAB_00379551;
              }
              p_Var3 = p_Var3->_M_nxt;
            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                    (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                    (ulong)uVar1 % local_68._M_bucket_count ==
                    (ulong)local_7c % local_68._M_bucket_count));
          }
          paVar5 = (src->
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pmVar8 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_7c);
          paVar4 = paVar5 + uVar10;
          dVar13 = paVar4->_M_elems[1];
          pmVar8->_M_elems[0] = paVar4->_M_elems[0];
          pmVar8->_M_elems[1] = dVar13;
          pmVar8->_M_elems[2] = paVar5[uVar10]._M_elems[2];
LAB_003794d5:
          uVar10 = uVar10 + 1;
          puVar7 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(faceVertexIndices->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7
                                 >> 2));
        __new_size = (size_type)(uVar12 + 1);
        dst = local_78;
      }
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
                (dst,__new_size);
      memset((dst->
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_start,0,__new_size * 0x18);
      bVar11 = true;
      for (_Var9._M_nxt = local_68._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
          _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
        uVar12 = *(uint *)&_Var9._M_nxt[1]._M_nxt;
        paVar4 = (dst->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        paVar4[uVar12]._M_elems[2] = (double)_Var9._M_nxt[4]._M_nxt;
        p_Var6 = _Var9._M_nxt[3]._M_nxt;
        paVar4 = paVar4 + uVar12;
        paVar4->_M_elems[0] = (double)_Var9._M_nxt[2]._M_nxt;
        paVar4->_M_elems[1] = (double)p_Var6;
      }
LAB_00379551:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar11;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}